

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
MiniScript::ListStorage<MiniScript::TACLine>::ListStorage
          (ListStorage<MiniScript::TACLine> *this,long slots)

{
  long slots_local;
  ListStorage<MiniScript::TACLine> *this_local;
  
  RefCountedStorage::RefCountedStorage(&this->super_RefCountedStorage);
  SimpleVector<MiniScript::TACLine>::SimpleVector
            (&this->super_SimpleVector<MiniScript::TACLine>,slots);
  (this->super_RefCountedStorage)._vptr_RefCountedStorage = (_func_int **)&PTR__ListStorage_001973e0
  ;
  return;
}

Assistant:

ListStorage(long slots) : SimpleVector<T>(slots) {}